

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
        *this)

{
  bool bVar1;
  slot_type *in_RDI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  *unaff_retaddr;
  size_t i;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
  *this_00;
  slot_type *capacity;
  
  capacity = in_RDI;
  bVar1 = empty((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                 *)0x235fa7);
  if (!bVar1) {
    if (in_RDI[3] < (slot_type)0x80) {
      if (in_RDI[3] != (slot_type)0x0) {
        for (this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                        *)0x0;
            this_00 !=
            (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
             *)in_RDI[3];
            this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                       *)((long)&this_00->ctrl_ + 1)) {
          bVar1 = IsFull(*(ctrl_t *)((long)&this_00->ctrl_ + (long)&(*in_RDI)->_vptr_statement_base)
                        );
          if (bVar1) {
            alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                       *)0x236016);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,void>::
            destroy<std::allocator<cs::statement_base*>>
                      ((allocator<cs::statement_base_*> *)this_00,in_RDI);
          }
        }
        in_RDI[2] = (slot_type)0x0;
        reset_ctrl(this_00,(size_t)in_RDI);
        reset_growth_left(unaff_retaddr,(size_t)capacity);
      }
    }
    else {
      destroy_slots(this);
    }
    bVar1 = empty((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                   *)0x236071);
    if (!bVar1) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base *>, phmap::priv::HashEq<cs::statement_base *>::Hash, phmap::priv::HashEq<cs::statement_base *>::Eq, std::allocator<cs::statement_base *>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<cs::statement_base *>, Hash = phmap::priv::HashEq<cs::statement_base *>::Hash, Eq = phmap::priv::HashEq<cs::statement_base *>::Eq, Alloc = std::allocator<cs::statement_base *>]"
                   );
    }
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)(in_RDI + 4),0,(size_t)in_RDI[3]);
  }
  return;
}

Assistant:

PHMAP_ATTRIBUTE_REINITIALIZES void clear()
			{
				// Iterating over this container is O(bucket_count()). When bucket_count()
				// is much greater than size(), iteration becomes prohibitively expensive.
				// For clear() it is more important to reuse the allocated array when the
				// container is small because allocation takes comparatively long time
				// compared to destruction of the elements of the container. So we pick the
				// largest bucket_count() threshold for which iteration is still fast and
				// past that we simply deallocate the array.
				if (empty())
					return;
				if (capacity_ > 127) {
					destroy_slots();
				}
				else if (capacity_) {
					for (size_t i = 0; i != capacity_; ++i) {
						if (IsFull(ctrl_[i])) {
							PolicyTraits::destroy(&alloc_ref(), slots_ + i);
						}
					}
					size_ = 0;
					reset_ctrl(capacity_);
					reset_growth_left(capacity_);
				}
				assert(empty());
				infoz_.RecordStorageChanged(0, capacity_);
			}